

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssbinExporter.cpp
# Opt level: O0

size_t Assimp::Write<aiQuaterniont<float>>(IOStream *stream,aiQuaternion *v)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  size_t t;
  aiQuaternion *v_local;
  IOStream *stream_local;
  
  sVar1 = Write<float>(stream,&v->w);
  sVar2 = Write<float>(stream,&v->x);
  sVar3 = Write<float>(stream,&v->y);
  sVar4 = Write<float>(stream,&v->z);
  if (sVar4 + sVar3 + sVar2 + sVar1 == 0x10) {
    return 0x10;
  }
  __assert_fail("t == 16",
                "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Assbin/AssbinExporter.cpp"
                ,0xb4,"size_t Assimp::Write(IOStream *, const aiQuaternion &)");
}

Assistant:

inline
size_t Write<aiQuaternion>(IOStream * stream, const aiQuaternion& v) {
    size_t t = Write<float>(stream,v.w);
    t += Write<float>(stream,v.x);
    t += Write<float>(stream,v.y);
    t += Write<float>(stream,v.z);
    ai_assert(t == 16);

    return 16;
}